

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

size_t __thiscall docopt::Option::hash(Option *this)

{
  size_t local_20;
  
  local_20 = LeafPattern::hash(&this->super_LeafPattern);
  hash_combine<std::__cxx11::string>(&local_20,&this->fShortOption);
  hash_combine<std::__cxx11::string>(&local_20,&this->fLongOption);
  return (local_20 >> 2) + 0x9e3779b9 + local_20 * 0x40 + (long)this->fArgcount ^ local_20;
}

Assistant:

virtual size_t hash() const override {
			size_t seed = LeafPattern::hash();
			hash_combine(seed, fShortOption);
			hash_combine(seed, fLongOption);
			hash_combine(seed, fArgcount);
			return seed;
		}